

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpd.cpp
# Opt level: O0

void __thiscall xmrig::Httpd::onHttpData(Httpd *this)

{
  HttpData *in_stack_00000458;
  Httpd *in_stack_00000460;
  
  onHttpData(in_stack_00000460,in_stack_00000458);
  return;
}

Assistant:

void xmrig::Httpd::onHttpData(const HttpData &data)
{
    if (data.method == HTTP_OPTIONS) {
        return HttpApiResponse(data.id()).end();
    }

    if (data.method == HTTP_GET && data.url == "/favicon.ico") {
#       ifdef _WIN32
        if (favicon != nullptr) {
            HttpResponse response(data.id());
            response.setHeader("Content-Type", "image/x-icon");

            return response.end(favicon, faviconSize);
        }
#       endif

        return HttpResponse(data.id(), 404).end();
    }

    if (data.method > 4) {
        return HttpApiResponse(data.id(), HTTP_STATUS_METHOD_NOT_ALLOWED).end();
    }

    const int status = auth(data);
    if (status != HTTP_STATUS_OK) {
        return HttpApiResponse(data.id(), status).end();
    }

    if (data.method != HTTP_GET) {
        if (m_base->config()->http().isRestricted()) {
            return HttpApiResponse(data.id(), HTTP_STATUS_FORBIDDEN).end();
        }

        if (!data.headers.count(kContentType) || data.headers.at(kContentType) != "application/json") {
            return HttpApiResponse(data.id(), HTTP_STATUS_UNSUPPORTED_MEDIA_TYPE).end();
        }
    }

    m_base->api()->request(data);
}